

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void key_iterator_suite::erase_base(void)

{
  bool bVar1;
  type v;
  const_reference lhs;
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1b8;
  iterator local_1b0;
  const_iterator local_198;
  undefined1 local_180 [8];
  iterator it;
  undefined1 local_118 [8];
  key_iterator where;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [24];
  variable data;
  
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[6],_true>
            (&local_a8,(char (*) [4])"key",(char (*) [6])"alpha");
  local_48._0_8_ = &local_a8;
  local_48._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_1b8 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_1b8 = local_1b8 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_1b8);
  } while (local_1b8 != &local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_begin
            ((key_iterator *)local_118,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::key_end
            ((key_iterator *)
             &it.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator!=
                    ((key_iterator *)local_118,
                     (key_iterator *)
                     &it.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  boost::detail::test_impl
            ("where != data.key_end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc80,"void key_iterator_suite::erase_base()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator
            ((key_iterator *)
             &it.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  lhs = trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::operator*
                  ((key_iterator *)local_118);
  v = trial::dynamic::operator==(lhs,(char (*) [4])"key");
  boost::detail::test_impl
            ("*where == \"key\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc81,"void key_iterator_suite::erase_base()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::base
            (&local_198,(key_iterator *)local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::erase
            ((iterator *)local_180,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_198)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_180,&local_1b0);
  boost::detail::test_impl
            ("it == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0xc83,"void key_iterator_suite::erase_base()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_180);
  trial::dynamic::basic_variable<std::allocator<char>_>::key_iterator::~key_iterator
            ((key_iterator *)local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void erase_base()
{
    variable data = map::make(
        {
            {"key", "alpha"}
        });
    auto where = data.key_begin();
    TRIAL_PROTOCOL_TEST(where != data.key_end());
    TRIAL_PROTOCOL_TEST(*where == "key");
    auto it = data.erase(where.base());
    TRIAL_PROTOCOL_TEST(it == data.end());
}